

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_optional.pb.cc
# Opt level: O3

void proto2_unittest::TestProto3OptionalMessage_NestedMessage::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  Arena *pAVar2;
  Arena *extraout_RDX;
  uint unaff_EBP;
  string *value;
  MessageLite *this;
  string local_48;
  
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    this = from_msg;
    MergeImpl();
    pAVar2 = extraout_RDX;
LAB_00d03d00:
    pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
  }
  else {
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 1) == 0) goto LAB_00d03cc4;
    value = (string *)(from_msg[1]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if (value->_M_string_length == 0) {
      if ((to_msg[1]._internal_metadata_.ptr_ & 3) == 0) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,anon_var_dwarf_a22956 + 5);
        *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 1;
        pAVar2 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar2 & 1) != 0) {
          pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[1]._internal_metadata_,&local_48,pAVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_00d03cc4;
    }
    *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 1;
    this = (MessageLite *)&to_msg[1]._internal_metadata_;
    pAVar2 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar2 & 1) != 0) goto LAB_00d03d00;
  }
  google::protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)this,value,pAVar2);
LAB_00d03cc4:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  }
  return;
}

Assistant:

void TestProto3OptionalMessage_NestedMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestProto3OptionalMessage_NestedMessage*>(&to_msg);
  auto& from = static_cast<const TestProto3OptionalMessage_NestedMessage&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestProto3OptionalMessage.NestedMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    if (!from._internal_s().empty()) {
      _this->_internal_set_s(from._internal_s());
    } else {
      if (_this->_impl_.s_.IsDefault()) {
        _this->_internal_set_s("");
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}